

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

parser_map *
argagg::validate_definitions
          (parser_map *__return_storage_ptr__,
          vector<argagg::definition,_std::allocator<argagg::definition>_> *definitions)

{
  char cVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  invalid_flag *piVar5;
  definition *pdVar6;
  pointer pdVar7;
  pointer flag;
  string local_208;
  pointer local_1e8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
  long_map;
  ostringstream msg;
  
  long_map._M_h._M_buckets = &long_map._M_h._M_single_bucket;
  long_map._M_h._M_bucket_count = 1;
  long_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  long_map._M_h._M_element_count = 0;
  long_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  long_map._M_h._M_rehash_policy._M_next_resize = 0;
  long_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  memset(__return_storage_ptr__,0,0x838);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(__return_storage_ptr__->long_map)._M_h,&long_map._M_h);
  pdVar7 = (definitions->super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = (definitions->
              super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  while( true ) {
    if (pdVar7 == local_1e8) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&long_map._M_h);
      return __return_storage_ptr__;
    }
    flag = (pdVar7->flags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pdVar7->flags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar2 == flag) break;
    for (; flag != pbVar2; flag = flag + 1) {
      bVar3 = is_valid_flag_definition((flag->_M_dataplus)._M_p);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
        poVar4 = std::operator<<(&msg.super_basic_ostream<char,_std::char_traits<char>_>,"flag \"");
        poVar4 = std::operator<<(poVar4,(string *)flag);
        poVar4 = std::operator<<(poVar4,"\" specified for option \"");
        poVar4 = std::operator<<(poVar4,(string *)pdVar7);
        std::operator<<(poVar4,"\" is invalid");
        piVar5 = (invalid_flag *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        invalid_flag::runtime_error(piVar5,&local_208);
        __cxa_throw(piVar5,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar3 = flag_is_short((flag->_M_dataplus)._M_p);
      if (bVar3) {
        cVar1 = (flag->_M_dataplus)._M_p[1];
        pdVar6 = (__return_storage_ptr__->short_map)._M_elems[cVar1];
        if (pdVar6 != (definition *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
          poVar4 = std::operator<<(&msg.super_basic_ostream<char,_std::char_traits<char>_>,
                                   "duplicate short flag \"");
          poVar4 = std::operator<<(poVar4,(string *)flag);
          poVar4 = std::operator<<(poVar4,"\" found, specified by both option  \"");
          poVar4 = std::operator<<(poVar4,(string *)pdVar7);
          poVar4 = std::operator<<(poVar4,"\" and option \"");
          std::operator<<(poVar4,(string *)pdVar6);
          piVar5 = (invalid_flag *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          invalid_flag::runtime_error(piVar5,&local_208);
          __cxa_throw(piVar5,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
        }
        (__return_storage_ptr__->short_map)._M_elems[cVar1] = pdVar7;
      }
      else {
        bVar3 = parser_map::known_long_flag(__return_storage_ptr__,flag);
        if (bVar3) {
          pdVar6 = parser_map::get_definition_for_long_flag(__return_storage_ptr__,flag);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
          poVar4 = std::operator<<(&msg.super_basic_ostream<char,_std::char_traits<char>_>,
                                   "duplicate long flag \"");
          poVar4 = std::operator<<(poVar4,(string *)flag);
          poVar4 = std::operator<<(poVar4,"\" found, specified by both option  \"");
          poVar4 = std::operator<<(poVar4,(string *)pdVar7);
          poVar4 = std::operator<<(poVar4,"\" and option \"");
          std::operator<<(poVar4,(string *)pdVar6);
          piVar5 = (invalid_flag *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          invalid_flag::runtime_error(piVar5,&local_208);
          __cxa_throw(piVar5,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::string((string *)&msg,(string *)flag);
        msg.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = pdVar7;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::definition_const*>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,argagg::definition_const*>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::definition_const*>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&__return_storage_ptr__->long_map,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    pdVar7 = pdVar7 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar4 = std::operator<<(&msg.super_basic_ostream<char,_std::char_traits<char>_>,"option \"");
  poVar4 = std::operator<<(poVar4,(string *)pdVar7);
  std::operator<<(poVar4,"\" has no flag definitions");
  piVar5 = (invalid_flag *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  invalid_flag::runtime_error(piVar5,&local_208);
  __cxa_throw(piVar5,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
parser_map validate_definitions(
  const std::vector<definition>& definitions)
{
  std::unordered_map<std::string, const definition*> long_map;
  parser_map map {{{nullptr}}, std::move(long_map)};

  for (auto& defn : definitions) {

    if (defn.flags.size() == 0) {
      std::ostringstream msg;
      msg << "option \"" << defn.name << "\" has no flag definitions";
      throw invalid_flag(msg.str());
    }

    for (auto& flag : defn.flags) {

      if (!is_valid_flag_definition(flag.data())) {
        std::ostringstream msg;
        msg << "flag \"" << flag << "\" specified for option \"" << defn.name
            << "\" is invalid";
        throw invalid_flag(msg.str());
      }

      if (flag_is_short(flag.data())) {
        const std::size_t short_flag_letter = static_cast<std::size_t>(flag[1]);
        const auto existing_short_flag =
          map.short_map[short_flag_letter];
        bool short_flag_already_exists = (existing_short_flag != nullptr);
        if (short_flag_already_exists) {
          std::ostringstream msg;
          msg << "duplicate short flag \"" << flag
              << "\" found, specified by both option  \"" << defn.name
              << "\" and option \"" << existing_short_flag->name;
          throw invalid_flag(msg.str());
        }
        map.short_map[static_cast<std::size_t>(short_flag_letter)] = &defn;
        continue;
      }

      // If we're here then this is a valid, long-style flag.
      if (map.known_long_flag(flag)) {
        const auto existing_long_flag = map.get_definition_for_long_flag(flag);
        std::ostringstream msg;
        msg << "duplicate long flag \"" << flag
            << "\" found, specified by both option  \"" << defn.name
            << "\" and option \"" << existing_long_flag->name;
        throw invalid_flag(msg.str());
      }
      map.long_map.insert(std::make_pair(flag, &defn));
    }
  }

  return map;
}